

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

void __thiscall
jess_unicode_case_folding_txt_Test::TestBody(jess_unicode_case_folding_txt_Test *this)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var5;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar6;
  pointer pfVar7;
  bool bVar8;
  Message *pMVar9;
  ostream *poVar10;
  folding_info *folded_codepoint;
  pointer val;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_00;
  char *pcVar11;
  long *local_a0;
  AssertionResult gtest_ar_;
  wchar32 local_80 [2];
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  vector<folding_info,_std::allocator<folding_info>_> folded_codepoints;
  
  read_CaseFolding_txt
            (&folded_codepoints,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/data/CaseFolding.txt"
            );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
       super__Vector_impl_data._M_start !=
       folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start ==
      folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"folded_codepoints.empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x219,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pfVar7 = folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (val = folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
               _M_impl.super__Vector_impl_data._M_start; val != pfVar7; val = val + 1) {
      gtest_ar_._0_4_ = jessilib::fold(val->in_codepoint);
      testing::internal::CmpHelperEQ<char32_t,unsigned_int>
                ((internal *)&gtest_ar,"jessilib::fold(folded_codepoint.in_codepoint)",
                 "folded_codepoint.out_codepoint",(char32_t *)&gtest_ar_,&val->out_codepoint);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        lVar4 = CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_);
        lVar2 = *(long *)(lVar4 + 0x10);
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(lVar4 + 0x28 + lVar3) = *(uint *)(lVar4 + 0x28 + lVar3) & 0xffffffb5 | 8;
        puVar1 = (uint *)(lVar4 + 0x28 + *(long *)(lVar2 + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        std::operator<<((ostream *)(lVar4 + 0x10),"lhs: ");
        *(undefined8 *)
         (CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x20 +
         *(long *)(*(long *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10) + -0x18)) = 4;
        pMVar9 = testing::Message::operator<<((Message *)&gtest_ar_,&val->in_codepoint);
        pMVar9 = testing::Message::operator<<(pMVar9,(char (*) [8])"; rhs: ");
        *(undefined8 *)
         (*(long *)pMVar9 + 0x20 + *(long *)(*(long *)(*(long *)pMVar9 + 0x10) + -0x18)) = 8;
        pMVar9 = testing::Message::operator<<(pMVar9,&val->out_codepoint);
        pcVar11 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar11 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21d,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,pMVar9);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar8 = jessilib::equalsi(val->in_codepoint,val->out_codepoint);
      gtest_ar_.success_ = bVar8;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar8) {
        testing::Message::Message((Message *)&gtest_ar__2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&gtest_ar,&gtest_ar_.success_,
                   "jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint)"
                   ,"false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_a0,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    bVar8 = testing::Test::HasFailure();
    if (bVar8) {
      folding_sets_from_folding_info
                ((vector<folding_set,_std::allocator<folding_set>_> *)&gtest_ar_,&folded_codepoints)
      ;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      _Var5.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = gtest_ar_._4_4_;
      _Var5.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = gtest_ar_.success_;
      _Var5.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_3_ = gtest_ar_._1_3_;
      gtest_ar__2.success_ =
           _Var5.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl !=
           (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      if (_Var5.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&gtest_ar,&gtest_ar__2.success_,"folding_sets.empty()","true");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x225,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_a0 != (long *)0x0) {
          (**(code **)(*local_a0 + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        std::_Vector_base<folding_set,_std::allocator<folding_set>_>::~_Vector_base
                  ((_Vector_base<folding_set,_std::allocator<folding_set>_> *)&gtest_ar_);
        goto LAB_001f78c6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      uVar6 = gtest_ar_.message_;
      this_00._M_head_impl._4_4_ = gtest_ar_._4_4_;
      this_00._M_head_impl._0_1_ = gtest_ar_.success_;
      this_00._M_head_impl._1_3_ = gtest_ar_._1_3_;
      for (; lVar2 = std::cout,
          (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )this_00._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )uVar6._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
          this_00._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(this_00._M_head_impl)->field_2 + 8)) {
        *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
             = *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                        *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar2 + -0x18)) =
             *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar2 + -0x18)
                      ) | 0x4000;
        poVar10 = std::operator<<(&std::cout,0x30);
        poVar10 = std::operator<<(poVar10,"{ ");
        poVar10 = std::operator<<(poVar10,"folding_set::mode_type::");
        pcVar11 = folding_set::type((folding_set *)this_00._M_head_impl);
        poVar10 = std::operator<<(poVar10,pcVar11);
        poVar10 = std::operator<<(poVar10,", ");
        poVar10 = std::operator<<(poVar10,"0x");
        *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 4;
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,", ");
        poVar10 = std::operator<<(poVar10,"0x");
        *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 4;
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,", ");
        *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
             *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        poVar10 = std::operator<<(poVar10," },");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"folded_codepoints.size(): ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10,"; folding_sets.size(): ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
      std::_Vector_base<folding_set,_std::allocator<folding_set>_>::~_Vector_base
                ((_Vector_base<folding_set,_std::allocator<folding_set>_> *)&gtest_ar_);
    }
    for (local_80[0] = L'\0'; local_80[0] != L'𐀀'; local_80[0] = local_80[0] + L'\x01') {
      bVar8 = std::
              binary_search<__gnu_cxx::__normal_iterator<folding_info*,std::vector<folding_info,std::allocator<folding_info>>>,char32_t>
                        ((__normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                          )folded_codepoints.
                           super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                           super__Vector_impl_data._M_start,
                         (__normal_iterator<folding_info_*,_std::vector<folding_info,_std::allocator<folding_info>_>_>
                          )folded_codepoints.
                           super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                           super__Vector_impl_data._M_finish,local_80);
      if (!bVar8) {
        gtest_ar_._0_4_ = jessilib::fold(local_80[0]);
        testing::internal::CmpHelperEQ<char32_t,char32_t>
                  ((internal *)&gtest_ar,"codepoint","jessilib::fold(codepoint)",local_80,
                   (char32_t *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar11 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar11 = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x238,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        bVar8 = jessilib::equalsi(local_80[0],local_80[0]);
        gtest_ar_.success_ = bVar8;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!bVar8) {
          testing::Message::Message((Message *)&gtest_ar__2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&gtest_ar,&gtest_ar_.success_,"jessilib::equalsi(codepoint, codepoint)","false"
                    );
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x239,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_a0,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
    }
  }
LAB_001f78c6:
  std::_Vector_base<folding_info,_std::allocator<folding_info>_>::~_Vector_base
            (&folded_codepoints.super__Vector_base<folding_info,_std::allocator<folding_info>_>);
  return;
}

Assistant:

TEST(jess, unicode_case_folding_txt) {
	auto folded_codepoints = read_CaseFolding_txt();
	ASSERT_FALSE(folded_codepoints.empty());

	// Test that every folded codepoint is equal to its folded equivalent
	for (auto& folded_codepoint : folded_codepoints) {
		EXPECT_EQ(jessilib::fold(folded_codepoint.in_codepoint), folded_codepoint.out_codepoint)
			<< std::hex << std::uppercase << "lhs: " << std::setw(4) << folded_codepoint.in_codepoint << "; rhs: " << std::setw(8) << folded_codepoint.out_codepoint;
		EXPECT_TRUE(jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint));
	}

	// If the above failed, print out what the fold table needs to be replaced with
	if (::testing::Test::HasFailure()) {
		auto folding_sets = folding_sets_from_folding_info(folded_codepoints);
		ASSERT_FALSE(folding_sets.empty());
		for (auto& set : folding_sets) {
			// Generate code in the format: { folding_set::mode_type::constant, 0x1234, 0x2345, 1 },
			std::cout << std::hex << std::uppercase << std::setfill('0') << "{ "
				<< "folding_set::mode_type::" << set.type()
				<< ", "
				<< "0x" << std::setw(4) << set.range_start << ", "
				<< "0x" << std::setw(4) << set.range_end << ", "
				<< std::dec << set.diff
				<< " }," << std::endl;
		}

		std::cout << "folded_codepoints.size(): " << folded_codepoints.size() << "; folding_sets.size(): " << folding_sets.size() << std::endl;
	}

	// Test that every non-folded codepoint in [0, 0xFFFF] is equal to itself; we already tested folded ones above
	for (char32_t codepoint = 0; codepoint != 0x10000; ++codepoint) {
		bool is_folded = std::binary_search(folded_codepoints.begin(), folded_codepoints.end(), codepoint);
		if (!is_folded) {
			EXPECT_EQ(codepoint, jessilib::fold(codepoint));
			EXPECT_TRUE(jessilib::equalsi(codepoint, codepoint));
		}
	}
}